

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

void __thiscall
ktxValidator::skipPadding(ktxValidator *this,validationContext *ctx,uint32_t alignment)

{
  uint uVar1;
  int *piVar2;
  char *args;
  _Alloc_hider _Var3;
  long *plVar4;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  long local_48 [2];
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  long local_20 [2];
  
  validationContext::skipPadding(ctx,alignment);
  uVar1 = *(uint *)(ctx->inp + *(long *)(*(long *)ctx->inp + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    if ((uVar1 & 2) == 0) {
      return;
    }
    local_60._0_4_ = IOError.UnexpectedEOF.code;
    plVar4 = local_48;
    local_58._M_p = (pointer)plVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,IOError.UnexpectedEOF.message._M_dataplus._M_p,
               IOError.UnexpectedEOF.message._M_dataplus._M_p +
               IOError.UnexpectedEOF.message._M_string_length);
    addIssue<int>(this,eFatal,(issue *)local_60,0);
    _Var3._M_p = local_58._M_p;
  }
  else {
    local_38._0_4_ = IOError.FileRead.code;
    plVar4 = local_20;
    local_30._M_p = (pointer)plVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_30,IOError.FileRead.message._M_dataplus._M_p,
               IOError.FileRead.message._M_dataplus._M_p + IOError.FileRead.message._M_string_length
              );
    piVar2 = __errno_location();
    args = strerror(*piVar2);
    addIssue<char*>(this,eFatal,(issue *)local_38,args);
    _Var3._M_p = local_30._M_p;
  }
  if ((long *)_Var3._M_p != plVar4) {
    operator_delete(_Var3._M_p,*plVar4 + 1);
  }
  return;
}

Assistant:

void skipPadding(validationContext& ctx, uint32_t alignment) {
        ctx.skipPadding(alignment);
        if (ctx.inp->fail())
            addIssue(logger::eFatal, IOError.FileRead, strerror(errno));
        else if (ctx.inp->eof())
            addIssue(logger::eFatal, IOError.UnexpectedEOF, 0);
    }